

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

uint32_t __thiscall
toml::detail::syntax::non_ascii_key_char::read_utf8(non_ascii_key_char *this,location *loc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint32_t codep_2;
  uint32_t c4;
  uint32_t c3_1;
  uint32_t c2_2;
  uint32_t c1_2;
  char_type_conflict b4;
  char_type_conflict b3_1;
  char_type_conflict b2_2;
  uint32_t codep_1;
  uint32_t c3;
  uint32_t c2_1;
  uint32_t c1_1;
  char_type_conflict b3;
  char_type_conflict b2_1;
  uint32_t codep;
  uint32_t c2;
  uint32_t c1;
  char_type_conflict b2;
  uchar b1;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc1;
  undefined1 in_stack_ffffffffffffffc2;
  undefined1 in_stack_ffffffffffffffc3;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_4;
  
  bVar1 = location::current((location *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  location::advance((location *)
                    CONCAT44(in_stack_ffffffffffffffc4,
                             CONCAT13(in_stack_ffffffffffffffc3,
                                      CONCAT12(in_stack_ffffffffffffffc2,
                                               CONCAT11(in_stack_ffffffffffffffc1,
                                                        in_stack_ffffffffffffffc0)))),
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar1 < 0x80) {
    local_4 = (uint)bVar1;
  }
  else if ((int)(uint)bVar1 >> 5 == 6) {
    bVar2 = location::current((location *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    location::advance((location *)
                      CONCAT44(in_stack_ffffffffffffffc4,
                               CONCAT13(in_stack_ffffffffffffffc3,
                                        CONCAT12(in_stack_ffffffffffffffc2,
                                                 CONCAT11(in_stack_ffffffffffffffc1,
                                                          in_stack_ffffffffffffffc0)))),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    local_4 = (bVar1 & 0x1f) * 0x40 + (bVar2 & 0x3f);
    if (local_4 < 0x80) {
      local_4 = 0xffffffff;
    }
  }
  else if ((int)(uint)bVar1 >> 4 == 0xe) {
    bVar2 = location::current((location *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    location::advance((location *)
                      CONCAT44(in_stack_ffffffffffffffc4,
                               CONCAT13(in_stack_ffffffffffffffc3,
                                        CONCAT12(in_stack_ffffffffffffffc2,
                                                 CONCAT11(in_stack_ffffffffffffffc1,
                                                          in_stack_ffffffffffffffc0)))),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar3 = location::eof((location *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if (bVar3) {
      local_4 = 0xffffffff;
    }
    else {
      bVar4 = location::current((location *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      location::advance((location *)
                        CONCAT44(in_stack_ffffffffffffffc4,
                                 CONCAT13(in_stack_ffffffffffffffc3,
                                          CONCAT12(in_stack_ffffffffffffffc2,
                                                   CONCAT11(in_stack_ffffffffffffffc1,
                                                            in_stack_ffffffffffffffc0)))),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      local_4 = (bVar1 & 0xf) * 0x1000 + (bVar2 & 0x3f) * 0x40 + (bVar4 & 0x3f);
      if (local_4 < 0x800) {
        local_4 = 0xffffffff;
      }
    }
  }
  else if ((int)(uint)bVar1 >> 3 == 0x1e) {
    bVar2 = location::current((location *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    location::advance((location *)
                      CONCAT44(in_stack_ffffffffffffffc4,
                               CONCAT13(bVar2,CONCAT12(in_stack_ffffffffffffffc2,
                                                       CONCAT11(in_stack_ffffffffffffffc1,
                                                                in_stack_ffffffffffffffc0)))),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    bVar3 = location::eof((location *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0))
    ;
    if (bVar3) {
      local_4 = 0xffffffff;
    }
    else {
      bVar4 = location::current((location *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      location::advance((location *)
                        CONCAT44(in_stack_ffffffffffffffc4,
                                 CONCAT13(bVar2,CONCAT12(bVar4,CONCAT11(in_stack_ffffffffffffffc1,
                                                                        in_stack_ffffffffffffffc0)))
                                ),CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar3 = location::eof((location *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (bVar3) {
        local_4 = 0xffffffff;
      }
      else {
        bVar5 = location::current((location *)
                                  CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        location::advance((location *)
                          CONCAT44(in_stack_ffffffffffffffc4,
                                   CONCAT13(bVar2,CONCAT12(bVar4,CONCAT11(bVar5,
                                                  in_stack_ffffffffffffffc0)))),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        local_4 = (bVar1 & 7) * 0x40000 + (bVar2 & 0x3f) * 0x1000 + (bVar4 & 0x3f) * 0x40 +
                  (bVar5 & 0x3f);
        if (local_4 < 0x10000) {
          local_4 = 0xffffffff;
        }
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

TOML11_INLINE std::uint32_t non_ascii_key_char::read_utf8(location& loc) const
{
    // U+0000   ... U+0079  ; 0xxx_xxxx
    // U+0080   ... U+07FF  ; 110y_yyyx 10xx_xxxx;
    // U+0800   ... U+FFFF  ; 1110_yyyy 10yx_xxxx 10xx_xxxx
    // U+010000 ... U+10FFFF; 1111_0yyy 10yy_xxxx 10xx_xxxx 10xx_xxxx

    const unsigned char b1 = loc.current(); loc.advance(1);
    if(b1 < 0x80)
    {
        return static_cast<std::uint32_t>(b1);
    }
    else if((b1 >> 5) == 6) // 0b110 == 6
    {
        const auto b2 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 5) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 6) + c2;

        if(codep < 0x80)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 4) == 14) // 0b1110 == 14
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 4) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);

        const std::uint32_t codep = (c1 << 12) + (c2 << 6) + c3;
        if(codep < 0x800)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else if((b1 >> 3) == 30) // 0b11110 == 30
    {
        const auto b2 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b3 = loc.current(); loc.advance(1); if(loc.eof()) {return 0xFFFFFFFF;}
        const auto b4 = loc.current(); loc.advance(1);

        const std::uint32_t c1 = b1 & ((1 << 3) - 1);
        const std::uint32_t c2 = b2 & ((1 << 6) - 1);
        const std::uint32_t c3 = b3 & ((1 << 6) - 1);
        const std::uint32_t c4 = b4 & ((1 << 6) - 1);
        const std::uint32_t codep = (c1 << 18) + (c2 << 12) + (c3 << 6) + c4;

        if(codep < 0x10000)
        {
            return 0xFFFFFFFF;
        }
        return codep;
    }
    else // not a Unicode codepoint in UTF-8
    {
        return 0xFFFFFFFF;
    }
}